

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int D_LoadDehLumps(void)

{
  bool bVar1;
  int iVar2;
  int local_14;
  int local_10;
  int count;
  int lumpnum;
  int lastlump;
  
  count = 0;
  local_14 = 0;
  while (iVar2 = FWadCollection::FindLump(&Wads,"DEHACKED",&count,false), -1 < iVar2) {
    bVar1 = D_LoadDehLump(iVar2);
    local_14 = (uint)bVar1 + local_14;
  }
  if ((PatchSize == 0) && (iVar2 = FIntCVar::operator_cast_to_int(&dehload), 0 < iVar2)) {
    iVar2 = FIntCVar::operator_cast_to_int(&dehload);
    if (iVar2 == 1) {
      local_10 = 0;
      count = FWadCollection::GetNumLumps(&Wads);
      for (; local_10 < count; local_10 = local_10 + 1) {
        bVar1 = isDehFile(local_10);
        if (bVar1) {
          bVar1 = D_LoadDehLump(local_10);
          local_14 = (uint)bVar1 + local_14;
        }
      }
    }
    else {
      local_10 = FWadCollection::GetNumLumps(&Wads);
      do {
        local_10 = local_10 + -1;
        if (local_10 < 0) {
          return local_14;
        }
        bVar1 = isDehFile(local_10);
      } while (!bVar1);
      bVar1 = D_LoadDehLump(local_10);
      local_14 = (uint)bVar1 + local_14;
    }
  }
  return local_14;
}

Assistant:

int D_LoadDehLumps()
{
	int lastlump = 0, lumpnum, count = 0;

	while ((lumpnum = Wads.FindLump("DEHACKED", &lastlump)) >= 0)
	{
		count += D_LoadDehLump(lumpnum);
	}

	if (0 == PatchSize && dehload > 0)
	{
		// No DEH/BEX patch is loaded yet, try to find lump(s) with specific extensions

		if (dehload == 1)	// load all .DEH lumps that are found.
		{
			for (lumpnum = 0, lastlump = Wads.GetNumLumps(); lumpnum < lastlump; ++lumpnum)
			{
				if (isDehFile(lumpnum))
				{
					count += D_LoadDehLump(lumpnum);
				}
			}
		}
		else 	// only load the last .DEH lump that is found.
		{
			for (lumpnum = Wads.GetNumLumps()-1; lumpnum >=0; --lumpnum)
			{
				if (isDehFile(lumpnum))
				{
					count += D_LoadDehLump(lumpnum);
					break;
				}
			}
		}
	}

	return count;
}